

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

string * __thiscall Tigre::String::getValue_abi_cxx11_(string *__return_storage_ptr__,String *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string Tigre::String::getValue(){
    return this->value;
}